

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

bool rcg::System::setSystemsPath(char *path,char *ignore)

{
  long lVar1;
  long lVar2;
  
  std::recursive_mutex::lock((recursive_mutex *)(anonymous_namespace)::system_mtx);
  lVar2 = DAT_0012f658;
  lVar1 = (anonymous_namespace)::system_list;
  if (DAT_0012f658 == (anonymous_namespace)::system_list) {
    std::__cxx11::string::assign((char *)&(anonymous_namespace)::system_path_abi_cxx11_);
    std::__cxx11::string::assign((anonymous_namespace)::system_ignore_abi_cxx11_);
    std::__cxx11::string::assign((char *)&(anonymous_namespace)::system_path_abi_cxx11_);
    if (ignore != (char *)0x0) {
      std::__cxx11::string::assign((anonymous_namespace)::system_ignore_abi_cxx11_);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::system_mtx);
  return lVar2 == lVar1;
}

Assistant:

bool System::setSystemsPath(const char *path, const char *ignore)
{
  std::lock_guard<std::recursive_mutex> lock(system_mtx);

  if (system_list.size() == 0)
  {
    system_path="";
    system_ignore="";

    if (path == 0 || path[0] == '\0')
    {
#ifdef _WIN32
      // under Windows, use the path to the current executable as fallback

      const size_t n=256;
      char procpath[n];
      std::string path_to_exe;
      if (GetModuleFileNameA(NULL, procpath, n-1) > 0)
      {
        procpath[n-1]='\0';

        char *p=strrchr(procpath, '\\');
        if (p != 0) *p='\0';

        path_to_exe=procpath;

        if (system_path.size() > 0) system_path+=";";

        system_path += path_to_exe;
      }

      // another fallback is the path to the current library

      const auto path_to_this_dll = getPathToThisDll();
      if (!path_to_this_dll.empty() && path_to_this_dll != path_to_exe)
      {
        if (system_path.size() > 0) system_path+=";";

        system_path += path_to_this_dll;
      }

	  // and possible sub-directories of the library

      HANDLE file_handle;
      WIN32_FIND_DATAA file_info;

      file_handle=FindFirstFileA((path_to_this_dll+"\\*").c_str(), &file_info);

      if (file_handle != INVALID_HANDLE_VALUE)
      {
        do
        {
          if ((file_info.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY) != 0 && file_info.cFileName[0] != '.' )
          {
            system_path += ";" + path_to_this_dll + "\\" + file_info.cFileName;
          }
        }
        while (FindNextFileA(file_handle, &file_info));

        FindClose(file_handle);
      }
#else
      // otherwise, use the absolute install path to the default transport layer

      system_path=GENTL_INSTALL_PATH;
#endif
    }
    else
    {
      system_path=path;
    }

    if (ignore != 0)
    {
      system_ignore=ignore;
    }

    return true;
  }

  return false;
}